

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_UInt16 higher_prime_index(UA_UInt32 n)

{
  ushort uVar1;
  ushort local_10;
  ushort local_e;
  UA_UInt16 mid;
  UA_UInt16 high;
  UA_UInt16 low;
  UA_UInt32 n_local;
  
  local_e = 0;
  local_10 = 0x1e;
  uVar1 = local_10;
  while (local_10 = uVar1, local_e != local_10) {
    uVar1 = local_e + (short)((int)((uint)local_10 - (uint)local_e) / 2);
    if (primes[uVar1] < n) {
      local_e = uVar1 + 1;
      uVar1 = local_10;
    }
  }
  return local_e;
}

Assistant:

static UA_UInt16
higher_prime_index(UA_UInt32 n) {
    UA_UInt16 low  = 0;
    UA_UInt16 high = (UA_UInt16)(sizeof(primes) / sizeof(UA_UInt32));
    while(low != high) {
        UA_UInt16 mid = (UA_UInt16)(low + ((high - low) / 2));
        if(n > primes[mid])
            low = (UA_UInt16)(mid + 1);
        else
            high = mid;
    }
    return low;
}